

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O0

void __thiscall
vkt::Draw::anon_unknown_0::DrawIndexedParams::DrawIndexedParams
          (DrawIndexedParams *this,VkPrimitiveTopology top,VkIndexType indexT,deUint32 indexC,
          deUint32 instanceC,deUint32 firstIdx,deInt32 vertexO,deUint32 firstIns)

{
  deUint32 firstIdx_local;
  deUint32 instanceC_local;
  deUint32 indexC_local;
  VkIndexType indexT_local;
  VkPrimitiveTopology top_local;
  DrawIndexedParams *this_local;
  
  DrawParamsBase::DrawParamsBase(&this->super_DrawParamsBase,top);
  IndexedParamsBase::IndexedParamsBase(&this->super_IndexedParamsBase,indexT);
  *(deUint32 *)&(this->super_IndexedParamsBase).field_0x1c = indexC;
  *(deUint32 *)&this->field_0x40 = instanceC;
  *(deUint32 *)&this->field_0x44 = firstIdx;
  *(deInt32 *)&this->field_0x48 = vertexO;
  *(deUint32 *)&this->field_0x4c = firstIns;
  return;
}

Assistant:

DrawIndexedParams (const vk::VkPrimitiveTopology top, const vk::VkIndexType indexT, const deUint32 indexC, const deUint32 instanceC, const deUint32 firstIdx, const deInt32 vertexO, const deUint32 firstIns)
		: DrawParamsBase	(top)
		, IndexedParamsBase	(indexT)
	{
		params.indexCount		= indexC;
		params.instanceCount	= instanceC;
		params.firstIndex		= firstIdx;
		params.vertexOffset		= vertexO;
		params.firstInstance	= firstIns;
	}